

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestCustomFieldOptions_Test::
DescriptorPoolTypeResolverTest_TestCustomFieldOptions_Test
          (DescriptorPoolTypeResolverTest_TestCustomFieldOptions_Test *this)

{
  DescriptorPoolTypeResolverTest_TestCustomFieldOptions_Test *this_local;
  
  DescriptorPoolTypeResolverTest::DescriptorPoolTypeResolverTest
            (&this->super_DescriptorPoolTypeResolverTest);
  (this->super_DescriptorPoolTypeResolverTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DescriptorPoolTypeResolverTest_TestCustomFieldOptions_Test_02a289b0;
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestCustomFieldOptions) {
  Type type;
  ASSERT_TRUE(
      resolver_
          ->ResolveMessageType(
              GetTypeUrl<proto2_unittest::TestMessageWithCustomOptions>(),
              &type)
          .ok());
  const Field* field = FindField(type, "field1");
  ASSERT_TRUE(field != nullptr);
  EXPECT_TRUE(HasUInt64Option(field->options(), "proto2_unittest.field_opt1",
                              8765432109));
}